

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O2

Result __thiscall wabt::ExprVisitor::VisitExpr(ExprVisitor *this,Expr *root_expr)

{
  pointer *ppSVar1;
  pointer *pppEVar2;
  pointer *ppiVar3;
  pointer pSVar4;
  pointer ppEVar5;
  pointer piVar6;
  Expr *base;
  State state;
  bool bVar7;
  Result RVar8;
  int iVar9;
  IfExpr *pIVar10;
  BlockExprBase<(wabt::ExprType)7> *pBVar11;
  IfExceptExpr *pIVar12;
  BlockExprBase<(wabt::ExprType)22> *pBVar13;
  TryExpr *pTVar14;
  reference expr;
  Delegate *pDVar16;
  ExprList *expr_list;
  iterator *this_00;
  iterator rhs;
  iterator rhs_00;
  iterator rhs_01;
  iterator rhs_02;
  iterator rhs_03;
  iterator rhs_04;
  iterator rhs_05;
  iterator rhs_06;
  iterator local_40;
  _func_int **pp_Var15;
  
  pSVar4 = (this->state_stack_).
           super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar4) {
    (this->state_stack_).
    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar4;
  }
  ppEVar5 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar5) {
    (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar5;
  }
  piVar6 = (this->expr_iter_stack_).
           super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_iter_stack_).
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_finish != piVar6) {
    (this->expr_iter_stack_).
    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
    ._M_impl.super__Vector_impl_data._M_finish = piVar6;
  }
  PushDefault(this,root_expr);
LAB_00d92767:
  do {
    pSVar4 = (this->state_stack_).
             super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->state_stack_).
        super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
        _M_impl.super__Vector_impl_data._M_start == pSVar4) {
      return (Result)Ok;
    }
  } while (Catch < pSVar4[-1]);
  ppEVar5 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  base = ppEVar5[-1];
  switch(pSVar4[-1]) {
  case Default:
    goto switchD_00d9278d_caseD_0;
  case Block:
    pBVar11 = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_03.node_ = (Expr *)0x0;
    rhs_03.list_ = &(pBVar11->block).exprs;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs_03);
    if (!bVar7) {
      iVar9 = (*this->delegate_->_vptr_Delegate[4])(this->delegate_,pBVar11);
LAB_00d92a53:
      if (iVar9 == 1) {
        return (Result)Error;
      }
      ppSVar1 = &(this->state_stack_).
                 super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      pppEVar2 = &(this->expr_stack_).
                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar2 = *pppEVar2 + -1;
      ppiVar3 = &(this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppiVar3 = *ppiVar3 + -1;
      goto LAB_00d92767;
    }
    break;
  case IfTrue:
    pIVar10 = cast<wabt::IfExpr,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_00.node_ = (Expr *)0x0;
    rhs_00.list_ = &(pIVar10->true_).exprs;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs_00);
    if (!bVar7) {
      iVar9 = (*this->delegate_->_vptr_Delegate[0x11])(this->delegate_,pIVar10);
      if (iVar9 == 1) {
        return (Result)Error;
      }
      ppSVar1 = &(this->state_stack_).
                 super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      pppEVar2 = &(this->expr_stack_).
                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar2 = *pppEVar2 + -1;
      ppiVar3 = &(this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppiVar3 = *ppiVar3 + -1;
      expr_list = &pIVar10->false_;
      state = IfFalse;
LAB_00d92929:
      PushExprlist(this,state,base,expr_list);
      goto LAB_00d92767;
    }
    break;
  case IfFalse:
    pIVar10 = cast<wabt::IfExpr,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_01.node_ = (Expr *)0x0;
    rhs_01.list_ = &pIVar10->false_;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs_01);
    if (!bVar7) {
      iVar9 = (*this->delegate_->_vptr_Delegate[0x12])(this->delegate_,pIVar10);
      goto LAB_00d92a53;
    }
    break;
  case IfExceptTrue:
    pIVar12 = cast<wabt::IfExceptExpr,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs.node_ = (Expr *)0x0;
    rhs.list_ = &(pIVar12->true_).exprs;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs);
    if (!bVar7) {
      iVar9 = (*this->delegate_->_vptr_Delegate[0x14])(this->delegate_,pIVar12);
      if (iVar9 == 1) {
        return (Result)Error;
      }
      ppSVar1 = &(this->state_stack_).
                 super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      pppEVar2 = &(this->expr_stack_).
                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar2 = *pppEVar2 + -1;
      ppiVar3 = &(this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppiVar3 = *ppiVar3 + -1;
      expr_list = &pIVar12->false_;
      state = IfExceptFalse;
      goto LAB_00d92929;
    }
    break;
  case IfExceptFalse:
    pIVar12 = cast<wabt::IfExceptExpr,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_04.node_ = (Expr *)0x0;
    rhs_04.list_ = &pIVar12->false_;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs_04);
    if (!bVar7) {
      iVar9 = (*this->delegate_->_vptr_Delegate[0x15])(this->delegate_,pIVar12);
      goto LAB_00d92a53;
    }
    break;
  case Loop:
    pBVar13 = cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_05.node_ = (Expr *)0x0;
    rhs_05.list_ = &(pBVar13->block).exprs;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs_05);
    if (!bVar7) {
      iVar9 = (*this->delegate_->_vptr_Delegate[0x18])(this->delegate_,pBVar13);
      goto LAB_00d92a53;
    }
    break;
  case Try:
    pTVar14 = cast<wabt::TryExpr,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_02.node_ = (Expr *)0x0;
    rhs_02.list_ = &(pTVar14->block).exprs;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs_02);
    if (!bVar7) {
      pDVar16 = this->delegate_;
      pp_Var15 = pDVar16->_vptr_Delegate;
      if ((pTVar14->catch_).size_ == 0) goto LAB_00d92a4d;
      iVar9 = (*pp_Var15[0x2e])(pDVar16,pTVar14);
      if (iVar9 == 1) {
        return (Result)Error;
      }
      ppSVar1 = &(this->state_stack_).
                 super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      pppEVar2 = &(this->expr_stack_).
                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar2 = *pppEVar2 + -1;
      expr_list = &pTVar14->catch_;
      ppiVar3 = &(this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppiVar3 = *ppiVar3 + -1;
      state = Catch;
      goto LAB_00d92929;
    }
    break;
  case Catch:
    pTVar14 = cast<wabt::TryExpr,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_06.node_ = (Expr *)0x0;
    rhs_06.list_ = &pTVar14->catch_;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs_06);
    if (!bVar7) {
      pDVar16 = this->delegate_;
      pp_Var15 = pDVar16->_vptr_Delegate;
LAB_00d92a4d:
      iVar9 = (*pp_Var15[0x2f])(pDVar16,pTVar14);
      goto LAB_00d92a53;
    }
  }
  local_40 = intrusive_list<wabt::Expr>::iterator::operator++(this_00,0);
  expr = intrusive_list<wabt::Expr>::iterator::operator*(&local_40);
  PushDefault(this,expr);
  goto LAB_00d92767;
switchD_00d9278d_caseD_0:
  (this->state_stack_).
  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
  super__Vector_impl_data._M_finish = pSVar4 + -1;
  (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppEVar5 + -1;
  RVar8 = HandleDefaultState(this,base);
  if (RVar8.enum_ == Error) {
    return (Result)Error;
  }
  goto LAB_00d92767;
}

Assistant:

Result ExprVisitor::VisitExpr(Expr* root_expr) {
  state_stack_.clear();
  expr_stack_.clear();
  expr_iter_stack_.clear();

  PushDefault(root_expr);

  while (!state_stack_.empty()) {
    State state = state_stack_.back();
    auto* expr = expr_stack_.back();

    switch (state) {
      case State::Default:
        PopDefault();
        CHECK_RESULT(HandleDefaultState(expr));
        break;

      case State::Block: {
        auto block_expr = cast<BlockExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != block_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndBlockExpr(block_expr));
          PopExprlist();
        }
        break;
      }

      case State::IfTrue: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->true_.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->AfterIfTrueExpr(if_expr));
          PopExprlist();
          PushExprlist(State::IfFalse, expr, if_expr->false_);
        }
        break;
      }

      case State::IfFalse: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->false_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndIfExpr(if_expr));
          PopExprlist();
        }
        break;
      }

      case State::IfExceptTrue: {
        auto if_except_expr = cast<IfExceptExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_except_expr->true_.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->AfterIfExceptTrueExpr(if_except_expr));
          PopExprlist();
          PushExprlist(State::IfExceptFalse, expr, if_except_expr->false_);
        }
        break;
      }

      case State::IfExceptFalse: {
        auto if_except_expr = cast<IfExceptExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_except_expr->false_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndIfExceptExpr(if_except_expr));
          PopExprlist();
        }
        break;
      }

      case State::Loop: {
        auto loop_expr = cast<LoopExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != loop_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndLoopExpr(loop_expr));
          PopExprlist();
        }
        break;
      }

      case State::Try: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          if (try_expr->catch_.empty()) {
            CHECK_RESULT(delegate_->EndTryExpr(try_expr));
            PopExprlist();
          } else {
            CHECK_RESULT(delegate_->OnCatchExpr(try_expr));
            PopExprlist();
            PushExprlist(State::Catch, expr, try_expr->catch_);
          }
        }
        break;
      }

      case State::Catch: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->catch_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndTryExpr(try_expr));
          PopExprlist();
        }
        break;
      }
    }
  }

  return Result::Ok;
}